

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::toCurrencyString
          (QString *__return_storage_ptr__,QLocale *this,qlonglong value,QString *symbol)

{
  ushort uVar1;
  QLocalePrivate *pQVar2;
  QLocaleData *pQVar3;
  anon_union_24_3_e3d07ef4_for_data *paVar4;
  long lVar5;
  undefined1 *puVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  QSystemLocale *pQVar11;
  quint16 *pqVar12;
  byte bVar13;
  long in_FS_OFFSET;
  QAnyStringView pattern;
  CurrencyToStringArgument arg;
  QString local_f8;
  QString local_d8;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_98,value);
    ::QVariant::QVariant((QVariant *)&local_78,(QVariant *)&local_98);
    local_58 = &((symbol->d).d)->super_QArrayData;
    pcStack_50 = (symbol->d).ptr;
    local_48 = (undefined1 *)(symbol->d).size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::~QVariant((QVariant *)&local_98);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = systemLocale();
    ::QVariant::QVariant((QVariant *)&local_b8,(QMetaType)0x6bf780,&local_78);
    (*pQVar11->_vptr_QSystemLocale[2])(&local_98,pQVar11,0x20,&local_b8);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_b8);
    lVar5 = (__return_storage_ptr__->d).size;
    if ((lVar5 == 0) && (pDVar7 = (__return_storage_ptr__->d).d, pDVar7 != (Data *)0x0)) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
    if (lVar5 != 0) goto LAB_00319f74;
  }
  pQVar2 = (this->d).d.ptr;
  pQVar3 = pQVar2->m_data;
  bVar13 = pQVar3->m_currencyFormatNegative_size;
  if (value < 0 && bVar13 != 0) {
    pqVar12 = &pQVar3->m_currencyFormatNegative_idx;
    value = -value;
  }
  else {
    bVar13 = pQVar3->m_currencyFormat_size;
    pqVar12 = &pQVar3->m_currencyFormat_idx;
  }
  uVar1 = *pqVar12;
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocaleData::longLongToString
            (&local_d8,pQVar2->m_data,value,-1,10,-1,
             (~(pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
               super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5);
  local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  paVar4 = (anon_union_24_3_e3d07ef4_for_data *)(symbol->d).ptr;
  if (paVar4 == (anon_union_24_3_e3d07ef4_for_data *)0x0) {
    currencySymbol(&local_f8,this,CurrencySymbol);
  }
  else {
    local_f8.d.d = (symbol->d).d;
    local_f8.d.size = (symbol->d).size;
    local_f8.d.ptr = (char16_t *)paVar4;
    if ((anon_union_24_3_e3d07ef4_for_data *)local_f8.d.d !=
        (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)local_f8.d.d = *(int *)local_f8.d.d + 1;
      UNLOCK();
    }
  }
  if ((undefined1 *)local_f8.d.size == (undefined1 *)0x0) {
    currencySymbol((QString *)&local_78,this,CurrencyIsoCode);
    uVar10 = local_78._16_8_;
    uVar9 = local_78.shared;
    pcVar8 = local_f8.d.ptr;
    pDVar7 = local_f8.d.d;
    paVar4 = (anon_union_24_3_e3d07ef4_for_data *)local_78.shared;
    local_f8.d.ptr = (char16_t *)local_78._8_8_;
    local_78.shared = (PrivateShared *)local_f8.d.d;
    local_f8.d.d = (Data *)uVar9;
    puVar6 = (undefined1 *)local_78._16_8_;
    local_78._8_8_ = pcVar8;
    local_78._16_8_ = local_f8.d.size;
    local_f8.d.size = uVar10;
    if ((anon_union_24_3_e3d07ef4_for_data *)pDVar7 != (anon_union_24_3_e3d07ef4_for_data *)0x0) {
      LOCK();
      *(int *)pDVar7 = *(int *)pDVar7 + -1;
      UNLOCK();
      if (*(int *)pDVar7 == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
  }
  pattern.field_0.m_data = (void *)((ulong)bVar13 | 0x8000000000000000);
  local_98._16_8_ = local_d8.d.size | 0x8000000000000000;
  local_78.shared = (PrivateShared *)&local_98;
  local_98.data[0] = '\x01';
  local_98._8_8_ = local_d8.d.ptr;
  local_b8._16_8_ = local_f8.d.size | 0x8000000000000000;
  local_78._8_8_ = &local_b8;
  local_b8.data[0] = '\x01';
  local_b8._8_8_ = local_f8.d.ptr;
  local_78._16_8_ = (undefined1 *)0x0;
  pattern.m_size = 2;
  QtPrivate::argToQString
            (__return_storage_ptr__,
             (QtPrivate *)
             (
             L"%1%2%1\xa0%2(%2%1)%2\xa0%1(%1\xa0%2)\x200f%1\xa0%2\x061c%1%2(\x061c%1%2)(%1%2)(%1)\xa0%2(%2\xa0%1)%2-%1%1\x202f%2\x200f%1\xa0\x200f%2\x200f\x200e-%1\xa0\x200f%2%2\xa0-%1%2−%1%2-\xa0%1\x200e%2\xa0%1\x200e(%2\xa0%1)"
             + uVar1),pattern,(size_t)&local_78,(ArgBase **)local_78.shared);
  if ((anon_union_24_3_e3d07ef4_for_data *)local_f8.d.d != (anon_union_24_3_e3d07ef4_for_data *)0x0)
  {
    LOCK();
    *(int *)local_f8.d.d = *(int *)local_f8.d.d + -1;
    UNLOCK();
    if (*(int *)local_f8.d.d == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00319f74:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toCurrencyString(qlonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QLocaleData::DataRange range = d->m_data->currencyFormatNegative();
    if (!range.size || value >= 0)
        range = d->m_data->currencyFormat();
    else
        value = -value;
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return range.viewData(currency_format_data).arg(str, sym);
}